

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDsd.c
# Opt level: O2

int Lpk_DsdAnalizeOne(Lpk_Fun_t *p,uint *(*ppTruths) [16],Kit_DsdNtk_t **pNtks,char *pCofVars,
                     int nCofDepth,Lpk_Res_t *pRes)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Kit_DsdNtk_t *p_00;
  Vec_Int_t *pVVar5;
  ulong uVar6;
  long lVar7;
  Vec_Int_t **ppVVar8;
  Vec_Int_t **ppVVar9;
  ulong uVar10;
  uint local_174;
  Vec_Int_t *pvBSets [4] [8];
  
  uVar1 = nCofDepth - 1;
  uVar10 = (ulong)uVar1;
  if (2 < uVar1) {
    __assert_fail("nCofDepth >= 1 && nCofDepth <= 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkAbcDsd.c"
                  ,0x17a,
                  "int Lpk_DsdAnalizeOne(Lpk_Fun_t *, unsigned int *(*)[16], Kit_DsdNtk_t **, char *, int, Lpk_Res_t *)"
                 );
  }
  if (nCofDepth < (int)((*(uint *)&p->field_0x8 >> 0xc & 0xf) - 1)) {
    if ((*(uint *)&p->field_0x8 >> 0x1e & 1) != 0) {
      uVar1 = 1 << ((byte)uVar1 & 0x1f);
      local_174 = p->uSupp;
      iVar4 = 0;
      for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
        iVar2 = Kit_DsdNonDsdSizeMax(pNtks[uVar6]);
        if (iVar4 < iVar2) {
          local_174 = Kit_DsdNonDsdSupports(pNtks[uVar6]);
          iVar4 = iVar2;
        }
        else if (iVar4 == iVar2) {
          uVar3 = Kit_DsdNonDsdSupports(pNtks[uVar6]);
          local_174 = local_174 | uVar3;
        }
      }
      uVar3 = Lpk_DsdLateArriving(p);
      if ((~uVar3 & local_174) == 0) {
        pRes->nSuppSizeS = 0;
        pRes->nSuppSizeL = 0;
        pRes->DelayEst = 0;
        pRes->AreaEst = 0;
        pRes->nBSVars = 0;
        pRes->BSVars = 0;
        pRes->nCofVars = 0;
        pRes->pCofVars[0] = '\0';
        pRes->pCofVars[1] = '\0';
        pRes->pCofVars[2] = '\0';
        pRes->pCofVars[3] = '\0';
        pRes->Variable = 0;
        pRes->Polarity = 0;
        iVar4 = 0;
      }
      else {
        uVar6 = (ulong)(uint)nCofDepth;
        iVar4 = Lpk_FunComputeMinSuppSizeVar
                          (p,ppTruths[uVar10],uVar1,ppTruths[uVar6],~uVar3 & local_174);
        pCofVars[uVar10] = (char)iVar4;
        for (lVar7 = 0; (uint)lVar7 >> ((byte)nCofDepth & 0x1f) == 0; lVar7 = lVar7 + 1) {
          if (pNtks[lVar7] != (Kit_DsdNtk_t *)0x0) {
            Kit_DsdNtkFree(pNtks[lVar7]);
          }
          p_00 = Kit_DsdDecomposeExpand(ppTruths[uVar6][lVar7],*(uint *)&p->field_0x8 >> 7 & 0x1f);
          pNtks[lVar7] = p_00;
          pVVar5 = Lpk_ComputeBoundSets(p_00,(*(uint *)&p->field_0x8 >> 0xc & 0xf) - nCofDepth);
          pvBSets[uVar6][lVar7] = pVVar5;
        }
        ppVVar8 = pvBSets[uVar6] + 1;
        for (; -1 < (int)uVar10; uVar10 = (ulong)((int)uVar10 - 1)) {
          ppVVar9 = ppVVar8;
          for (lVar7 = 0; (uint)lVar7 >> ((byte)uVar10 & 0x1f) == 0; lVar7 = lVar7 + 1) {
            pVVar5 = Lpk_MergeBoundSets((*(Vec_Int_t *(*) [8])(ppVVar9 + -1))[0],*ppVVar9,
                                        (*(uint *)&p->field_0x8 >> 0xc & 0xf) - nCofDepth);
            pvBSets[uVar10][lVar7] = pVVar5;
            ppVVar9 = ppVVar9 + 2;
          }
          ppVVar8 = ppVVar8 + -8;
        }
        Lpk_FunCompareBoundSets(p,pvBSets[0][0],nCofDepth,local_174,uVar3,pRes);
        for (uVar1 = nCofDepth; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
          for (lVar7 = 0; (uint)lVar7 >> ((byte)uVar1 & 0x1f) == 0; lVar7 = lVar7 + 1) {
            Vec_IntFree(pvBSets[uVar1][lVar7]);
          }
        }
        if (pRes->BSVars == 0) {
          iVar4 = 1;
        }
        else {
          pRes->nCofVars = nCofDepth;
          iVar4 = 1;
          for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
            pRes->pCofVars[uVar10] = pCofVars[uVar10];
          }
        }
      }
      return iVar4;
    }
    __assert_fail("p->fSupports",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkAbcDsd.c"
                  ,0x17c,
                  "int Lpk_DsdAnalizeOne(Lpk_Fun_t *, unsigned int *(*)[16], Kit_DsdNtk_t **, char *, int, Lpk_Res_t *)"
                 );
  }
  __assert_fail("nCofDepth < (int)p->nLutK - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkAbcDsd.c"
                ,0x17b,
                "int Lpk_DsdAnalizeOne(Lpk_Fun_t *, unsigned int *(*)[16], Kit_DsdNtk_t **, char *, int, Lpk_Res_t *)"
               );
}

Assistant:

int Lpk_DsdAnalizeOne( Lpk_Fun_t * p, unsigned * ppTruths[5][16], Kit_DsdNtk_t * pNtks[], char pCofVars[], int nCofDepth, Lpk_Res_t * pRes )
{
    int fVerbose = 0;
    Vec_Int_t * pvBSets[4][8];
    unsigned uNonDecSupp, uLateArrSupp;
    int i, k, nNonDecSize, nNonDecSizeMax;
    assert( nCofDepth >= 1 && nCofDepth <= 3 );
    assert( nCofDepth < (int)p->nLutK - 1 );
    assert( p->fSupports );

    // find the support of the largest non-DSD block
    nNonDecSizeMax = 0;
    uNonDecSupp = p->uSupp;
    for ( i = 0; i < (1<<(nCofDepth-1)); i++ )
    {
        nNonDecSize = Kit_DsdNonDsdSizeMax( pNtks[i] );
        if ( nNonDecSizeMax < nNonDecSize )
        {
            nNonDecSizeMax = nNonDecSize;
            uNonDecSupp = Kit_DsdNonDsdSupports( pNtks[i] );
        }
        else if ( nNonDecSizeMax == nNonDecSize )
            uNonDecSupp |= Kit_DsdNonDsdSupports( pNtks[i] );
    }

    // remove those variables that cannot be used because of delay constraints
    // if variables arrival time is more than p->DelayLim - 2, it cannot be used
    uLateArrSupp = Lpk_DsdLateArriving( p );
    if ( (uNonDecSupp & ~uLateArrSupp) == 0 )
    {
        memset( pRes, 0, sizeof(Lpk_Res_t) );
        return 0;
    }

    // find the next cofactoring variable
    pCofVars[nCofDepth-1] = Lpk_FunComputeMinSuppSizeVar( p, ppTruths[nCofDepth-1], 1<<(nCofDepth-1), ppTruths[nCofDepth], uNonDecSupp & ~uLateArrSupp );

    // derive decomposed networks
    for ( i = 0; i < (1<<nCofDepth); i++ )
    {
        if ( pNtks[i] )
            Kit_DsdNtkFree( pNtks[i] );
        pNtks[i] = Kit_DsdDecomposeExpand( ppTruths[nCofDepth][i], p->nVars );
if ( fVerbose )
Kit_DsdPrint( stdout, pNtks[i] );
        pvBSets[nCofDepth][i] = Lpk_ComputeBoundSets( pNtks[i], p->nLutK - nCofDepth ); // try restricting to those in uNonDecSupp!!!
    }

    // derive the set of feasible boundsets
    for ( i = nCofDepth - 1; i >= 0; i-- )
        for ( k = 0; k < (1<<i); k++ )
            pvBSets[i][k] = Lpk_MergeBoundSets( pvBSets[i+1][2*k+0], pvBSets[i+1][2*k+1], p->nLutK - nCofDepth );
    // compare bound-sets
    Lpk_FunCompareBoundSets( p, pvBSets[0][0], nCofDepth, uNonDecSupp, uLateArrSupp, pRes );
    // free the bound sets
    for ( i = nCofDepth; i >= 0; i-- )
        for ( k = 0; k < (1<<i); k++ )
            Vec_IntFree( pvBSets[i][k] );
 
    // copy the cofactoring variables
    if ( pRes->BSVars )
    {
        pRes->nCofVars = nCofDepth;
        for ( i = 0; i < nCofDepth; i++ )
            pRes->pCofVars[i] = pCofVars[i];
    }
    return 1;
}